

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O1

void serialization::serialize<serialization::json_oarchive,Customize>
               (json_oarchive *ar,Customize *v)

{
  char *pcVar1;
  
  pcVar1 = (ar->writer_).level_stack_.stack_;
  (ar->buffer_).stack_.stackTop_ = (ar->buffer_).stack_.stack_;
  (ar->writer_).os_ = &ar->buffer_;
  (ar->writer_).hasRoot_ = false;
  (ar->writer_).level_stack_.stackTop_ = pcVar1;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&ar->writer_);
  Customize::serialize_impl<serialization::json_oarchive>(v,ar);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&ar->writer_,0);
  return;
}

Assistant:

void serialize(Archive & ar, const Value & v)
{
    ar.serialize_start();
    serialization::serialize_helper(ar, v);
    ar.serialize_end();
}